

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

bool __thiscall cmCTestSVN::UpdateImpl(cmCTestSVN *this)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  string *arg;
  pointer pbVar7;
  vector<const_char_*,_std::allocator<const_char_*>_> svn_update;
  OutputLogger err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string opts;
  UpdateParser out;
  string local_1d8;
  undefined1 local_1b8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  string local_160;
  undefined1 local_140 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [14];
  char *local_38;
  
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  pcVar1 = local_140 + 0x10;
  local_140._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"UpdateOptions","");
  cmCTest::GetCTestConfiguration(&local_160,pcVar2,(string *)local_140);
  if ((pointer)local_140._0_8_ != pcVar1) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if (local_160._M_string_length == 0) {
    pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"SVNUpdateOptions","");
    cmCTest::GetCTestConfiguration((string *)local_140,pcVar2,(string *)local_1b8);
    std::__cxx11::string::operator=((string *)&local_160,(string *)local_140);
    if ((pointer)local_140._0_8_ != pcVar1) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
  }
  cmSystemTools::ParseArguments(&local_178,&local_160);
  iVar4 = cmCTest::GetTestModel((this->super_cmCTestGlobalVC).super_cmCTestVC.CTest);
  if (iVar4 == 1) {
    cmCTestVC::GetNightlyTime_abi_cxx11_(&local_1d8,(cmCTestVC *)this);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x7e4bdb);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      local_1b8._16_8_ = *psVar6;
      local_1b8._24_8_ = plVar5[3];
      local_1b8._0_8_ = local_1b8 + 0x10;
    }
    else {
      local_1b8._16_8_ = *psVar6;
      local_1b8._0_8_ = (size_type *)*plVar5;
    }
    local_1b8._8_8_ = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append(local_1b8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      local_140._16_8_ = *psVar6;
      local_140._24_8_ = plVar5[3];
      local_140._0_8_ = pcVar1;
    }
    else {
      local_140._16_8_ = *psVar6;
      local_140._0_8_ = (size_type *)*plVar5;
    }
    local_140._8_8_ = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
    if ((pointer)local_140._0_8_ != pcVar1) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  local_1d8._M_dataplus._M_p = (pointer)0x0;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_140._0_8_ = "update";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)local_140);
  if (local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar7 = local_178.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_140._0_8_ = (pbVar7->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)local_140);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_178.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  UpdateParser::UpdateParser((UpdateParser *)local_140,this,"up-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_1b8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"up-err> ")
  ;
  bVar3 = RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1d8,
                        (OutputParser *)local_140,(OutputParser *)local_1b8);
  local_1b8._0_8_ = &PTR__LineParser_009ac580;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._24_8_ != &local_190) {
    operator_delete((void *)local_1b8._24_8_,local_190._M_allocated_capacity + 1);
  }
  local_140._0_8_ = &PTR__UpdateParser_009ab738;
  if (local_38 != (char *)0x0) {
    operator_delete__(local_38);
  }
  local_140._0_8_ = &PTR__LineParser_009ac580;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._24_8_ != local_118) {
    operator_delete((void *)local_140._24_8_,local_118[0]._M_allocated_capacity + 1);
  }
  if (local_1d8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    local_1d8.field_2._M_allocated_capacity - (long)local_1d8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCTestSVN::UpdateImpl()
{
  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("SVNUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);

  // Specify the start time for nightly testing.
  if (this->CTest->GetTestModel() == cmCTest::NIGHTLY) {
    args.push_back("-r{" + this->GetNightlyTime() + " +0000}");
  }

  std::vector<char const*> svn_update;
  svn_update.push_back("update");
  for (std::string const& arg : args) {
    svn_update.push_back(arg.c_str());
  }

  UpdateParser out(this, "up-out> ");
  OutputLogger err(this->Log, "up-err> ");
  return this->RunSVNCommand(svn_update, &out, &err);
}